

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O1

basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__H_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::tuple<>_>
* __thiscall
nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<>>::
subcommand<(char)72,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)110,std::__cxx11::string>>>>
          (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__H_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::tuple<>_>
           *__return_storage_ptr__,void *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *help,
          basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *command)

{
  pointer pcVar1;
  subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__H_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  s;
  undefined1 local_1c0 [32];
  _Alloc_hider local_1a0;
  char local_190 [16];
  _Alloc_hider local_180;
  char local_170 [16];
  _Alloc_hider local_160;
  char local_150 [24];
  _Head_base<0UL,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_138;
  subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__H_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_f8;
  
  local_1c0._0_8_ = local_1c0 + 0x10;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1c0,pcVar1,pcVar1 + name->_M_string_length);
  local_1a0._M_p = local_190;
  pcVar1 = (help->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a0,pcVar1,pcVar1 + help->_M_string_length);
  local_180._M_p = local_170;
  pcVar1 = (command->m_header)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_180,pcVar1,pcVar1 + (command->m_header)._M_string_length);
  local_160._M_p = local_150;
  pcVar1 = (command->m_footer)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_160,pcVar1,pcVar1 + (command->m_footer)._M_string_length);
  std::
  _Head_base<0UL,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'n',_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  ::_Head_base(&local_138,
               (_Head_base<0UL,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                *)&command->m_arguments);
  std::
  _Head_base<0ul,nonsugar::detail::subcommand<std::__cxx11::string,char,(char)72,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)110,std::__cxx11::string>>>>,false>
  ::
  _Head_base<nonsugar::detail::subcommand<std::__cxx11::string,char,(char)72,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)110,std::__cxx11::string>>>>>
            ((_Head_base<0ul,nonsugar::detail::subcommand<std::__cxx11::string,char,(char)72,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)110,std::__cxx11::string>>>>,false>
              *)&local_f8,
             (subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__H_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_1c0);
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'H',_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'n',_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::tuple<>_>
  ::basic_command(__return_storage_ptr__,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)this + 0x20),(tuple<> *)((long)this + 0x40),
                  (tuple<nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__H_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)&local_f8,(tuple<> *)((long)this + 0x42));
  detail::
  subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'H',_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'n',_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~subcommand(&local_f8);
  detail::
  subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'H',_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'n',_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~subcommand((subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__H_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)local_1c0);
  return __return_storage_ptr__;
}

Assistant:

auto subcommand(String const &name, String const &help, Command const &command) const
    {
        detail::subcommand<String, OptionType, Option, Command> s { name, help, command };
        return detail::make_command<String, OptionType>(
            m_header, m_footer, m_flags, detail::tuple_append(m_subcommands, std::move(s)),
            m_arguments);
    }